

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_state_select_resp(Curl_easy *data,int imapcode,imapstate instate)

{
  connectdata *pcVar1;
  IMAP *pIVar2;
  bool bVar3;
  int iVar4;
  CURLcode CVar5;
  char *pcVar6;
  undefined1 local_78 [8];
  dynbuf uid;
  char *p;
  size_t len;
  char *line;
  imap_conn *imapc;
  IMAP *imap;
  connectdata *conn;
  CURLcode result;
  imapstate instate_local;
  int imapcode_local;
  Curl_easy *data_local;
  
  conn._4_4_ = CURLE_OK;
  pcVar1 = data->conn;
  pIVar2 = (data->req).p.imap;
  pcVar6 = Curl_dyn_ptr(&(data->conn->proto).ftpc.pp.recvbuf);
  if (imapcode == 0x2a) {
    iVar4 = curl_strnequal(pcVar6 + 2,"OK [UIDVALIDITY ",0x10);
    if (iVar4 != 0) {
      p = (char *)0x0;
      uid.toobig = (size_t)(pcVar6 + 0x12);
      while( true ) {
        bVar3 = false;
        if (((p < (char *)0x14) && (bVar3 = false, *(char *)(uid.toobig + (long)p) != '\0')) &&
           (bVar3 = false, '/' < *(char *)(uid.toobig + (long)p))) {
          bVar3 = *(char *)(uid.toobig + (long)p) < ':';
        }
        if (!bVar3) break;
        p = p + 1;
      }
      if ((p != (char *)0x0) && (*(char *)(uid.toobig + (long)p) == ']')) {
        Curl_dyn_init((dynbuf *)local_78,0x14);
        CVar5 = Curl_dyn_addn((dynbuf *)local_78,(void *)uid.toobig,(size_t)p);
        if (CVar5 != CURLE_OK) {
          return CURLE_OUT_OF_MEMORY;
        }
        (*Curl_cfree)((pcVar1->proto).ftpc.server_os);
        pcVar6 = Curl_dyn_ptr((dynbuf *)local_78);
        (pcVar1->proto).ftpc.server_os = pcVar6;
      }
    }
  }
  else if (imapcode == 1) {
    if (((pIVar2->uidvalidity == (char *)0x0) || ((pcVar1->proto).ftpc.server_os == (char *)0x0)) ||
       (iVar4 = curl_strequal(pIVar2->uidvalidity,(pcVar1->proto).ftpc.server_os), iVar4 != 0)) {
      pcVar6 = (*Curl_cstrdup)(pIVar2->mailbox);
      (pcVar1->proto).imapc.mailbox = pcVar6;
      if ((pcVar1->proto).ftpc.retr_size_saved == 0) {
        return CURLE_OUT_OF_MEMORY;
      }
      if (pIVar2->custom == (char *)0x0) {
        if (pIVar2->query == (char *)0x0) {
          conn._4_4_ = imap_perform_fetch(data);
        }
        else {
          conn._4_4_ = imap_perform_search(data);
        }
      }
      else {
        conn._4_4_ = imap_perform_list(data);
      }
    }
    else {
      Curl_failf(data,"Mailbox UIDVALIDITY has changed");
      conn._4_4_ = CURLE_REMOTE_FILE_NOT_FOUND;
    }
  }
  else {
    Curl_failf(data,"Select failed");
    conn._4_4_ = CURLE_LOGIN_DENIED;
  }
  return conn._4_4_;
}

Assistant:

static CURLcode imap_state_select_resp(struct Curl_easy *data, int imapcode,
                                       imapstate instate)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct IMAP *imap = data->req.p.imap;
  struct imap_conn *imapc = &conn->proto.imapc;
  const char *line = Curl_dyn_ptr(&data->conn->proto.imapc.pp.recvbuf);

  (void)instate; /* no use for this yet */

  if(imapcode == '*') {
    /* See if this is an UIDVALIDITY response */
    if(checkprefix("OK [UIDVALIDITY ", line + 2)) {
      size_t len = 0;
      const char *p = &line[2] + strlen("OK [UIDVALIDITY ");
      while((len < 20) && p[len] && ISDIGIT(p[len]))
        len++;
      if(len && (p[len] == ']')) {
        struct dynbuf uid;
        Curl_dyn_init(&uid, 20);
        if(Curl_dyn_addn(&uid, p, len))
          return CURLE_OUT_OF_MEMORY;
        free(imapc->mailbox_uidvalidity);
        imapc->mailbox_uidvalidity = Curl_dyn_ptr(&uid);
      }
    }
  }
  else if(imapcode == IMAP_RESP_OK) {
    /* Check if the UIDVALIDITY has been specified and matches */
    if(imap->uidvalidity && imapc->mailbox_uidvalidity &&
       !strcasecompare(imap->uidvalidity, imapc->mailbox_uidvalidity)) {
      failf(data, "Mailbox UIDVALIDITY has changed");
      result = CURLE_REMOTE_FILE_NOT_FOUND;
    }
    else {
      /* Note the currently opened mailbox on this connection */
      DEBUGASSERT(!imapc->mailbox);
      imapc->mailbox = strdup(imap->mailbox);
      if(!imapc->mailbox)
        return CURLE_OUT_OF_MEMORY;

      if(imap->custom)
        result = imap_perform_list(data);
      else if(imap->query)
        result = imap_perform_search(data);
      else
        result = imap_perform_fetch(data);
    }
  }
  else {
    failf(data, "Select failed");
    result = CURLE_LOGIN_DENIED;
  }

  return result;
}